

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNMemArgBase::fold_constants(CTPNMemArgBase *this,CTcPrsSymtab *symtab)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  pp_Var1 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNMemArgBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the object and property expressions */
    obj_expr_ = obj_expr_->fold_constants(symtab);
    prop_expr_ = prop_expr_->fold_constants(symtab);

    /* 
     *   fold constants in the argument list; an argument list node never
     *   changes to a new node type during constant folding, so we don't
     *   need to update the member 
     */
    arglist_->fold_constants(symtab);

    /* return myself with no further evaluation */
    return this;
}